

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QLine>::reallocateAndGrow
          (QArrayDataPointer<QLine> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QLine> *old)

{
  long lVar1;
  bool bVar2;
  QPodArrayOps<QLine> *this_00;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<QLine> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QLine> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  QArrayDataPointer<QLine> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QLine> *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) || (bVar2 = needsDetach(in_stack_ffffffffffffff80), bVar2))
     || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QLine> *)&DAT_aaaaaaaaaaaaaaaa,-0x5555555555555556,0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<QLine> *)
                  operator->((QArrayDataPointer<QLine> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QLine> *)0x4fcefc);
        begin((QArrayDataPointer<QLine> *)0x4fcf0b);
        QtPrivate::QPodArrayOps<QLine>::copyAppend
                  (this_00,(QLine *)in_stack_ffffffffffffff88,(QLine *)in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (QArrayDataPointer<QLine> *)
             operator->((QArrayDataPointer<QLine> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QLine> *)0x4fcf44);
        begin((QArrayDataPointer<QLine> *)0x4fcf53);
        QtPrivate::QPodArrayOps<QLine>::moveAppend
                  ((QPodArrayOps<QLine> *)in_stack_ffffffffffffff80,
                   (QLine *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (QLine *)0x4fcf71);
      }
    }
    swap(in_stack_ffffffffffffff80,
         (QArrayDataPointer<QLine> *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff80,
           (QArrayDataPointer<QLine> *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
          );
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff80);
    freeSpaceAtEnd(in_stack_ffffffffffffff88);
    QtPrivate::QPodArrayOps<QLine>::reallocate
              ((QPodArrayOps<QLine> *)in_stack_ffffffffffffff88,(qsizetype)in_stack_ffffffffffffff80
               ,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }